

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O0

void floor0_free_look(vorbis_look_floor *i)

{
  vorbis_look_floor0 *look;
  vorbis_look_floor *i_local;
  
  if (i != (vorbis_look_floor *)0x0) {
    if (*(long *)((long)i + 0x10) != 0) {
      free(*(void **)((long)i + 0x10));
    }
    if (*(long *)((long)i + 0x20) != 0) {
      free(*(void **)((long)i + 0x20));
    }
    memset(i,0,0x28);
    free(i);
  }
  return;
}

Assistant:

static void floor0_free_look(vorbis_look_floor *i){
  vorbis_look_floor0 *look=(vorbis_look_floor0 *)i;
  if(look){

    if(look->linearmap)_ogg_free(look->linearmap);
    if(look->lsp_look)_ogg_free(look->lsp_look);
    memset(look,0,sizeof(*look));
    _ogg_free(look);
  }
}